

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPlatform.cpp
# Opt level: O1

uint8_t __thiscall GmmLib::PlatformInfo::ValidateCCS(PlatformInfo *this,GMM_TEXTURE_INFO *Surf)

{
  if (2 < Surf->Type - RESOURCE_2D) {
    if (Surf->Type != RESOURCE_2D) {
      return '\0';
    }
    if (Surf->MaxLod != 0) {
      return '\0';
    }
  }
  return (~*(uint *)&(Surf->Flags).Info & 0x20100000) != 0;
}

Assistant:

uint8_t GmmLib::PlatformInfo::ValidateCCS(GMM_TEXTURE_INFO &Surf)
{
    if(!(                                                             //--- Legitimate CCS Case ----------------------------------------
       ((Surf.Type >= RESOURCE_2D && Surf.Type <= RESOURCE_BUFFER) && //Not supported: 1D; Supported: Buffer, 2D, 3D, cube, Arrays, mip-maps, MSAA, Depth/Stencil
        (Surf.Type <= RESOURCE_CUBE)) ||
       (Surf.Type == RESOURCE_2D && Surf.MaxLod == 0)))
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage!");
        return 0;
    }

    if(Surf.Flags.Info.RenderCompressed && Surf.Flags.Info.MediaCompressed)
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage - can't be both RC and MC!");
        return 0;
    }

    return 1;
}